

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fVertexAttributeBindingStateQueryTests.cpp
# Opt level: O0

void __thiscall
deqp::gles31::Functional::anon_unknown_1::MixedVertexBindingOffsetCase::test
          (MixedVertexBindingOffsetCase *this,ResultCollector *result)

{
  deUint32 *this_00;
  int iVar1;
  deUint32 buffer_00;
  RenderContext *pRVar2;
  undefined4 extraout_var;
  TestLog *log;
  undefined1 local_48 [8];
  Buffer buffer;
  CallLogWrapper gl;
  ResultCollector *result_local;
  MixedVertexBindingOffsetCase *this_local;
  
  pRVar2 = gles31::Context::getRenderContext((this->super_IndexedCase).super_TestCase.m_context);
  iVar1 = (*pRVar2->_vptr_RenderContext[3])();
  log = tcu::TestContext::getLog
                  ((this->super_IndexedCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)
  ;
  glu::CallLogWrapper::CallLogWrapper
            ((CallLogWrapper *)&buffer.super_ObjectWrapper.m_object,
             (Functions *)CONCAT44(extraout_var,iVar1),log);
  pRVar2 = gles31::Context::getRenderContext((this->super_IndexedCase).super_TestCase.m_context);
  glu::TypedObjectWrapper<(glu::ObjectType)1>::TypedObjectWrapper
            ((TypedObjectWrapper<(glu::ObjectType)1> *)local_48,pRVar2);
  this_00 = &buffer.super_ObjectWrapper.m_object;
  glu::CallLogWrapper::enableLogging((CallLogWrapper *)this_00,true);
  buffer_00 = glu::ObjectWrapper::operator*((ObjectWrapper *)local_48);
  glu::CallLogWrapper::glBindBuffer((CallLogWrapper *)this_00,0x8892,buffer_00);
  glu::CallLogWrapper::glVertexAttribPointer
            ((CallLogWrapper *)&buffer.super_ObjectWrapper.m_object,1,4,0x1406,'\0',0,(void *)0xc);
  deqp::gls::StateQueryUtil::verifyStateIndexedInteger
            (result,(CallLogWrapper *)&buffer.super_ObjectWrapper.m_object,0x82d7,1,0xc,
             (this->super_IndexedCase).m_verifier);
  glu::TypedObjectWrapper<(glu::ObjectType)1>::~TypedObjectWrapper
            ((TypedObjectWrapper<(glu::ObjectType)1> *)local_48);
  glu::CallLogWrapper::~CallLogWrapper((CallLogWrapper *)&buffer.super_ObjectWrapper.m_object);
  return;
}

Assistant:

void MixedVertexBindingOffsetCase::test (tcu::ResultCollector& result)
{
	glu::CallLogWrapper gl					(m_context.getRenderContext().getFunctions(), m_testCtx.getLog());
	glu::Buffer			buffer				(m_context.getRenderContext());

	gl.enableLogging(true);

	gl.glBindBuffer(GL_ARRAY_BUFFER, *buffer);
	gl.glVertexAttribPointer(1, 4, GL_FLOAT, GL_FALSE, 0, (const deUint8*)DE_NULL + 12);

	verifyStateIndexedInteger(result, gl, GL_VERTEX_BINDING_OFFSET, 1, 12, m_verifier);
}